

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DJB.cpp
# Opt level: O2

uint32_t __thiscall llvm::caseFoldingDjbHash(llvm *this,StringRef Buffer,uint32_t H)

{
  llvm *this_00;
  llvm lVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  int iVar4;
  ConversionResult CVar5;
  uint32_t uVar6;
  uint *puVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  UTF8 *pUVar11;
  StringRef SVar12;
  undefined1 local_60 [8];
  StringRef Buffer_local;
  llvm *plStack_48;
  array<unsigned_char,_4UL> Storage;
  OptionalStorage<unsigned_int,_true> local_40;
  Optional<unsigned_int> Result;
  UTF32 local_30;
  UTF32 C;
  
  uVar10 = Buffer.Length;
  Buffer_local.Data = Buffer.Data;
  uVar6 = (uint32_t)Buffer.Length;
  local_60 = (undefined1  [8])this;
  bVar3 = true;
  for (pcVar8 = (char *)0x0; Buffer_local.Data != pcVar8; pcVar8 = pcVar8 + 1) {
    lVar1 = this[(long)pcVar8];
    uVar9 = (byte)lVar1 + 0x20;
    if (0x19 < (byte)((char)lVar1 + 0xbfU)) {
      uVar9 = (uint)(byte)lVar1;
    }
    uVar10 = (ulong)(uVar9 + (int)uVar10 * 0x21);
    bVar3 = (bool)(bVar3 & -1 < (char)lVar1);
  }
  local_40 = (OptionalStorage<unsigned_int,_true>)(uVar10 & 0xffffffff | 0x100000000);
  if (bVar3) {
    puVar7 = optional_detail::OptionalStorage<unsigned_int,_true>::getValue(&local_40);
    uVar6 = *puVar7;
  }
  else {
    this_00 = (llvm *)((long)&Buffer_local.Length + 4);
    pcVar8 = Buffer_local.Data;
    while (SVar12 = _local_60, pcVar8 != (char *)0x0) {
      auVar2 = local_60;
      local_40.field_0 =
           (anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2)local_60._0_4_;
      local_40.hasVal = (bool)local_60[4];
      local_40._5_3_ = local_60._5_3_;
      plStack_48 = (llvm *)&Result.Storage.hasVal;
      pUVar11 = (UTF8 *)(pcVar8 + (long)local_60);
      _local_60 = SVar12;
      ConvertUTF8toUTF32((UTF8 **)&local_40,pUVar11,(UTF32 **)&stack0xffffffffffffffb8,&local_30,
                         lenientConversion);
      _local_60 = StringRef::drop_front((StringRef *)local_60,(long)local_40 - (long)auVar2);
      iVar4 = 0x69;
      if ((Result.Storage._4_4_ & 0xfffffffe) != 0x130) {
        iVar4 = sys::unicode::foldCharSimple(Result.Storage._4_4_);
      }
      local_40 = (OptionalStorage<unsigned_int,_true>)&Result.Storage.hasVal;
      pUVar11 = (UTF8 *)&stack0xffffffffffffffb8;
      plStack_48 = this_00;
      Result.Storage._4_4_ = iVar4;
      CVar5 = ConvertUTF32toUTF8((UTF32 **)&local_40,&local_30,(UTF8 **)&stack0xffffffffffffffb8,
                                 pUVar11,strictConversion);
      if (CVar5 != conversionOK) {
        __assert_fail("CR == conversionOK && \"Case folding produced invalid char?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DJB.cpp"
                      ,0x2d,"StringRef toUTF8(UTF32, MutableArrayRef<UTF8>)");
      }
      SVar12.Data = (long)plStack_48 - (long)this_00;
      SVar12.Length._0_4_ = uVar6;
      SVar12.Length._4_4_ = 0;
      uVar6 = djbHash(this_00,SVar12,(uint32_t)pUVar11);
      pcVar8 = Buffer_local.Data;
    }
  }
  return uVar6;
}

Assistant:

uint32_t llvm::caseFoldingDjbHash(StringRef Buffer, uint32_t H) {
  if (Optional<uint32_t> Result = fastCaseFoldingDjbHash(Buffer, H))
    return *Result;

  std::array<UTF8, UNI_MAX_UTF8_BYTES_PER_CODE_POINT> Storage;
  while (!Buffer.empty()) {
    UTF32 C = foldCharDwarf(chopOneUTF32(Buffer));
    StringRef Folded = toUTF8(C, Storage);
    H = djbHash(Folded, H);
  }
  return H;
}